

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O2

void __thiscall
capnp::anon_unknown_0::MembranePipelineHook::~MembranePipelineHook(MembranePipelineHook *this)

{
  kj::Own<capnp::MembranePolicy,_std::nullptr_t>::dispose(&this->policy);
  kj::Own<capnp::PipelineHook,_std::nullptr_t>::dispose(&this->inner);
  kj::Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

MembranePipelineHook(
      kj::Own<PipelineHook>&& inner, kj::Own<MembranePolicy>&& policy, bool reverse)
      : inner(kj::mv(inner)), policy(kj::mv(policy)), reverse(reverse) {}